

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-parse.c
# Opt level: O2

void * fy_ensure_lookahead_slow_path(fy_parser *fyp,size_t size,size_t *leftp)

{
  ulong uVar1;
  int iVar2;
  void *pvVar3;
  void *ptr;
  size_t sVar4;
  size_t *leftp_00;
  size_t left;
  
  leftp_00 = &left;
  if (leftp != (size_t *)0x0) {
    leftp_00 = leftp;
  }
  pvVar3 = fyp->current_ptr;
  if (pvVar3 == (void *)0x0) {
    pvVar3 = fy_ptr_slow_path(fyp,leftp_00);
    sVar4 = *leftp_00;
    if (pvVar3 == (void *)0x0) goto LAB_00129044;
  }
  else {
    sVar4 = fyp->current_left;
    *leftp_00 = sVar4;
  }
  if (size <= sVar4) {
    return pvVar3;
  }
LAB_00129044:
  fy_parser_diag(fyp,0x20,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-parse.c"
                 ,0x240,"fy_ensure_lookahead_slow_path","ensure lookahead size=%zd left=%zd",size,
                 sVar4);
  ptr = fy_parse_input_try_pull(fyp,fyp->current_input,size,leftp_00);
  pvVar3 = (void *)0x0;
  if (ptr != (void *)0x0) {
    uVar1 = *leftp_00;
    if (uVar1 < size) {
      pvVar3 = (void *)0x0;
    }
    else {
      fyp->current_ptr = ptr;
      fyp->current_left = uVar1;
      iVar2 = fy_utf8_get(ptr,(int)uVar1,&fyp->current_w);
      fyp->current_c = iVar2;
      pvVar3 = ptr;
    }
  }
  return pvVar3;
}

Assistant:

const void *fy_ensure_lookahead_slow_path(struct fy_parser *fyp, size_t size, size_t *leftp) {
    const void *p;
    size_t left;

    if (!leftp)
        leftp = &left;

    p = fy_ptr(fyp, leftp);
    if (!p || *leftp < size) {
        fyp_scan_debug(fyp, "ensure lookahead size=%zd left=%zd",
                       size, *leftp);

        p = fy_parse_input_try_pull(fyp, fyp->current_input, size, leftp);
        if (!p || *leftp < size)
            return NULL;

        fyp->current_ptr = p;
        fyp->current_left = *leftp;
        fyp->current_c = fy_utf8_get(fyp->current_ptr, fyp->current_left, &fyp->current_w);
    }
    return p;
}